

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O0

_Bool build_simple(chunk_conflict *c,loc centre,wchar_t rating)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  int iVar4;
  int iVar5;
  wchar_t y1_00;
  wchar_t x1_00;
  wchar_t y2_00;
  wchar_t y2_01;
  wchar_t x2_00;
  wchar_t x2_01;
  loc lVar6;
  loc_conflict lVar7;
  square_conflict *psVar8;
  uint32_t local_130;
  uint32_t local_12c;
  uint32_t local_dc;
  uint32_t local_d8;
  wchar_t offy_1;
  wchar_t offx_1;
  wchar_t offy;
  wchar_t offx;
  wchar_t width;
  wchar_t height;
  wchar_t light;
  wchar_t x2;
  wchar_t y2;
  wchar_t x1;
  wchar_t y1;
  wchar_t x;
  wchar_t y;
  wchar_t rating_local;
  chunk_conflict *c_local;
  int iStack_10;
  loc centre_local;
  
  unique0x10000540 = centre;
  uVar2 = Rand_div(4);
  uVar3 = Rand_div(3);
  iVar4 = uVar2 + uVar3 + 3;
  uVar2 = Rand_div(0xb);
  uVar3 = Rand_div(0xb);
  iVar5 = uVar2 + uVar3 + 3;
  event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,iVar4 + L'\x02',iVar5 + L'\x02');
  if (((iStack_10 < c->height) && (c_local._4_4_ < c->width)) ||
     (_Var1 = find_space((loc *)((long)&c_local + 4),iVar4 + L'\x02',iVar5 + L'\x02'), _Var1)) {
    y1_00 = iStack_10 - iVar4 / 2;
    x1_00 = c_local._4_4_ - iVar5 / 2;
    y2_00 = y1_00 + iVar4;
    y2_01 = y2_00 + L'\xffffffff';
    x2_00 = x1_00 + iVar5;
    x2_01 = x2_00 + L'\xffffffff';
    iVar4 = c->depth;
    uVar2 = Rand_div(0x19);
    width = (wchar_t)(iVar4 <= (int)(uVar2 + 1));
    generate_room(c,y1_00 + L'\xffffffff',x1_00 + L'\xffffffff',y2_00,x2_00,width);
    draw_rectangle(c,y1_00 + L'\xffffffff',x1_00 + L'\xffffffff',y2_00,x2_00,FEAT_GRANITE,L'\f',
                   false);
    fill_rectangle(c,y1_00,x1_00,y2_01,x2_01,FEAT_FLOOR,L'\0');
    uVar2 = Rand_div(0x14);
    if (uVar2 == 0) {
      if ((x2_01 - x1_00) % 2 == 0) {
        local_d8 = 0;
      }
      else {
        local_d8 = Rand_div(2);
      }
      if ((y2_01 - y1_00) % 2 == 0) {
        local_dc = 0;
      }
      else {
        local_dc = Rand_div(2);
      }
      event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"pillared");
      for (y1 = y1_00 + local_dc; y1 <= y2_01; y1 = y1 + L'\x02') {
        for (x1 = x1_00 + local_d8; x1 <= x2_01; x1 = x1 + L'\x02') {
          lVar6 = loc(x1,y1);
          set_marked_granite(c,lVar6,L'\v');
        }
      }
      if (local_dc == 0) {
        if (local_d8 == 0) {
          lVar7 = (loc_conflict)loc(x1_00 + L'\xffffffff',y1_00 + L'\xffffffff');
          psVar8 = square((chunk *)c,lVar7);
          flag_off(psVar8->info,3,4);
          lVar7 = (loc_conflict)loc(x1_00 + L'\xffffffff',y1_00 + L'\xffffffff');
          psVar8 = square((chunk *)c,lVar7);
          flag_off(psVar8->info,3,0xc);
        }
        if (((x2_01 - x1_00) - local_d8) % 2 == 0) {
          lVar7 = (loc_conflict)loc(x2_00,y1_00 + L'\xffffffff');
          psVar8 = square((chunk *)c,lVar7);
          flag_off(psVar8->info,3,4);
          lVar7 = (loc_conflict)loc(x2_00,y1_00 + L'\xffffffff');
          psVar8 = square((chunk *)c,lVar7);
          flag_off(psVar8->info,3,0xc);
        }
      }
      if (((y2_01 - y1_00) - local_dc) % 2 == 0) {
        if (local_d8 == 0) {
          lVar7 = (loc_conflict)loc(x1_00 + L'\xffffffff',y2_00);
          psVar8 = square((chunk *)c,lVar7);
          flag_off(psVar8->info,3,4);
          lVar7 = (loc_conflict)loc(x1_00 + L'\xffffffff',y2_00);
          psVar8 = square((chunk *)c,lVar7);
          flag_off(psVar8->info,3,0xc);
        }
        if (((x2_01 - x1_00) - local_d8) % 2 == 0) {
          lVar7 = (loc_conflict)loc(x2_00,y2_00);
          psVar8 = square((chunk *)c,lVar7);
          flag_off(psVar8->info,3,4);
          lVar7 = (loc_conflict)loc(x2_00,y2_00);
          psVar8 = square((chunk *)c,lVar7);
          flag_off(psVar8->info,3,0xc);
        }
      }
    }
    else {
      uVar2 = Rand_div(0x32);
      if (uVar2 == 0) {
        if ((x2_01 - x1_00) % 2 == 0) {
          local_12c = 0;
        }
        else {
          local_12c = Rand_div(2);
        }
        if ((y2_01 - y1_00) % 2 == 0) {
          local_130 = 0;
        }
        else {
          local_130 = Rand_div(2);
        }
        event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"ragged");
        for (y1 = y1_00 + L'\x02' + local_130; y1 <= y2_00 + L'\xfffffffd'; y1 = y1 + L'\x02') {
          lVar6 = loc(x1_00,y1);
          set_marked_granite(c,lVar6,L'\v');
          lVar6 = loc(x2_01,y1);
          set_marked_granite(c,lVar6,L'\v');
        }
        for (x1 = x1_00 + L'\x02' + local_12c; x1 <= x2_00 + L'\xfffffffd'; x1 = x1 + L'\x02') {
          lVar6 = loc(x1,y1_00);
          set_marked_granite(c,lVar6,L'\v');
          lVar6 = loc(x1,y2_01);
          set_marked_granite(c,lVar6,L'\v');
        }
      }
    }
    centre_local.x._3_1_ = true;
  }
  else {
    centre_local.x._3_1_ = false;
  }
  return centre_local.x._3_1_;
}

Assistant:

bool build_simple(struct chunk *c, struct loc centre, int rating)
{
	int y, x, y1, x1, y2, x2;
	int light = false;

	/* Pick a room size */
	int height = 1 + randint1(4) + randint1(3);
	int width = 1 + randint1(11) + randint1(11);

	/* Find and reserve some space in the dungeon.  Get center of room. */
	event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE, height + 2, width + 2);
	if ((centre.y >= c->height) || (centre.x >= c->width)) {
		if (!find_space(&centre, height + 2, width + 2))
			return (false);
	}

	/* Set bounds */
	y1 = centre.y - height / 2;
	x1 = centre.x - width / 2;
	y2 = y1 + height - 1;
	x2 = x1 + width - 1;

	/* Occasional light */
	if (c->depth <= randint1(25)) light = true;

	/* Generate new room */
	generate_room(c, y1-1, x1-1, y2+1, x2+1, light);

	/* Generate outer walls and inner floors */
	draw_rectangle(c, y1-1, x1-1, y2+1, x2+1, FEAT_GRANITE,
		SQUARE_WALL_OUTER, false);
	fill_rectangle(c, y1, x1, y2, x2, FEAT_FLOOR, SQUARE_NONE);

	if (one_in_(20)) {
		/*
		 * Sometimes make a pillar room.
		 * If a dimension is even, don't always put a pillar in the
		 * upper left corner.
		 */
		int offx = ((x2 - x1) % 2 == 0) ? 0 : randint0(2);
		int offy = ((y2 - y1) % 2 == 0) ? 0 : randint0(2);

		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, "pillared");

		for (y = y1 + offy; y <= y2; y += 2)
			for (x = x1 + offx; x <= x2; x += 2)
				set_marked_granite(c, loc(x, y), SQUARE_WALL_INNER);
		/*
		 * Drop room/outer wall flags on corners if not adjacent to a
		 * floor.  Lets tunnels enter those grids.
		 */
		if (!offy) {
			if (!offx) {
				sqinfo_off(square(c, loc(x1 - 1, y1 - 1))->info,
					SQUARE_ROOM);
				sqinfo_off(square(c, loc(x1 - 1, y1 - 1))->info,
					SQUARE_WALL_OUTER);
			}
			if ((x2 - x1 - offx) % 2 == 0) {
				sqinfo_off(square(c, loc(x2 + 1, y1 - 1))->info,
					SQUARE_ROOM);
				sqinfo_off(square(c, loc(x2 + 1, y1 - 1))->info,
					SQUARE_WALL_OUTER);
			}
		}
		if ((y2 - y1 - offy) % 2 == 0) {
			if (!offx) {
				sqinfo_off(square(c, loc(x1 - 1, y2 + 1))->info,
					SQUARE_ROOM);
				sqinfo_off(square(c, loc(x1 - 1, y2 + 1))->info,
					SQUARE_WALL_OUTER);
			}
			if ((x2 - x1 - offx) % 2 == 0) {
				sqinfo_off(square(c, loc(x2 + 1, y2 + 1))->info,
					SQUARE_ROOM);
				sqinfo_off(square(c, loc(x2 + 1, y2 + 1))->info,
					SQUARE_WALL_OUTER);
			}
		}
	} else if (one_in_(50)) {
		/*
		 * Sometimes make a ragged-edge room.
		 * If a dimension is even, don't always put the first
		 * indentations at (x1, y1 + 2) and (x1 + 2, y1).
		 */
		int offx = ((x2 - x1) % 2 == 0) ? 0 : randint0(2);
		int offy = ((y2 - y1) % 2 == 0) ? 0 : randint0(2);

		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, "ragged");

		for (y = y1 + 2 + offy; y <= y2 - 2; y += 2) {
			set_marked_granite(c, loc(x1, y), SQUARE_WALL_INNER);
			set_marked_granite(c, loc(x2, y), SQUARE_WALL_INNER);
		}

		for (x = x1 + 2 + offx; x <= x2 - 2; x += 2) {
			set_marked_granite(c, loc(x, y1), SQUARE_WALL_INNER);
			set_marked_granite(c, loc(x, y2), SQUARE_WALL_INNER);
		}
	}
	return true;
}